

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaResub.c
# Opt level: O3

void Gia_ManPrintDivStats(Gia_Man_t *p,Vec_Wec_t *vMffcs,Vec_Wec_t *vPivots)

{
  int iVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  long lVar5;
  long lVar6;
  int iVar7;
  undefined1 auVar8 [16];
  double dVar9;
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  double dVar12;
  undefined1 auVar13 [16];
  
  iVar1 = vMffcs->nSize;
  if ((long)iVar1 < 1) {
    iVar3 = 0;
    dVar9 = 0.0;
  }
  else {
    lVar6 = 0;
    iVar3 = 0;
    iVar7 = 0;
    do {
      iVar2 = *(int *)((long)&vMffcs->pArray->nSize + lVar6);
      if ((iVar2 < 2) || (iVar2 == 2)) {
        __assert_fail("i >= 0 && i < p->nSize",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecInt.h"
                      ,0x1a9,"int Vec_IntEntry(Vec_Int_t *, int)");
      }
      lVar5 = *(long *)((long)&vMffcs->pArray->pArray + lVar6);
      iVar4 = *(int *)(lVar5 + 8) + *(int *)(lVar5 + 4);
      iVar7 = (iVar7 + iVar2 + -3) - iVar4;
      iVar3 = iVar3 + (uint)(iVar2 + -3 == iVar4);
      lVar6 = lVar6 + 0x10;
    } while ((long)iVar1 << 4 != lVar6);
    dVar9 = (double)iVar7;
  }
  dVar12 = (double)(~(p->vCos->nSize + p->vCis->nSize) + p->nObjs);
  iVar7 = 1;
  if (1 < iVar1 - iVar3) {
    iVar7 = iVar1 - iVar3;
  }
  printf("Collected %d (%.1f %%) MFFCs and %d (%.1f %%) have no divisors (div ave for others is %.2f).\n"
         ,((double)iVar1 * 100.0) / dVar12,((double)iVar3 * 100.0) / dVar12,dVar9 / (double)iVar7);
  lVar6 = (long)vMffcs->nCap << 4;
  auVar8._8_4_ = (int)((ulong)lVar6 >> 0x20);
  auVar8._0_8_ = lVar6;
  auVar8._12_4_ = 0x45300000;
  dVar9 = (auVar8._8_8_ - 1.9342813113834067e+25) +
          ((double)CONCAT44(0x43300000,(int)lVar6) - 4503599627370496.0);
  if (0 < (long)vMffcs->nSize) {
    lVar6 = 0;
    do {
      lVar5 = (long)*(int *)((long)&vMffcs->pArray->nCap + lVar6) << 2;
      auVar11._8_4_ = (int)((ulong)lVar5 >> 0x20);
      auVar11._0_8_ = lVar5;
      auVar11._12_4_ = 0x45300000;
      dVar9 = dVar9 + (auVar11._8_8_ - 1.9342813113834067e+25) +
                      ((double)CONCAT44(0x43300000,(int)lVar5) - 4503599627370496.0);
      lVar6 = lVar6 + 0x10;
    } while ((long)vMffcs->nSize * 0x10 != lVar6);
  }
  if (vPivots == (Vec_Wec_t *)0x0) {
    dVar12 = 0.0;
  }
  else {
    lVar6 = (long)vPivots->nCap << 4;
    auVar10._8_4_ = (int)((ulong)lVar6 >> 0x20);
    auVar10._0_8_ = lVar6;
    auVar10._12_4_ = 0x45300000;
    dVar12 = (auVar10._8_8_ - 1.9342813113834067e+25) +
             ((double)CONCAT44(0x43300000,(int)lVar6) - 4503599627370496.0);
    if (0 < (long)vPivots->nSize) {
      lVar6 = 0;
      do {
        lVar5 = (long)*(int *)((long)&vPivots->pArray->nCap + lVar6) << 2;
        auVar13._8_4_ = (int)((ulong)lVar5 >> 0x20);
        auVar13._0_8_ = lVar5;
        auVar13._12_4_ = 0x45300000;
        dVar12 = dVar12 + (auVar13._8_8_ - 1.9342813113834067e+25) +
                          ((double)CONCAT44(0x43300000,(int)lVar5) - 4503599627370496.0);
        lVar6 = lVar6 + 0x10;
      } while ((long)vPivots->nSize * 0x10 != lVar6);
    }
  }
  printf("Using %.2f MB for MFFCs and %.2f MB for pivots.   ",dVar9 * 9.5367431640625e-07,
         dVar12 * 9.5367431640625e-07);
  return;
}

Assistant:

void Gia_ManPrintDivStats( Gia_Man_t * p, Vec_Wec_t * vMffcs, Vec_Wec_t * vPivots ) 
{
    int fVerbose = 0;
    Vec_Int_t * vMffc;
    int i, nDivs, nDivsAll = 0, nDivs0 = 0;
    Vec_WecForEachLevel( vMffcs, vMffc, i )
    {
        nDivs = Vec_IntSize(vMffc) - 3 - Vec_IntEntry(vMffc, 1) - Vec_IntEntry(vMffc, 2);
        nDivs0 += (nDivs == 0);
        nDivsAll += nDivs;
        if ( !fVerbose )
            continue;
        printf( "%6d : ",      Vec_IntEntry(vMffc, 0) );
        printf( "Leaf =%3d  ", Vec_IntEntry(vMffc, 1) );
        printf( "Mffc =%4d  ", Vec_IntEntry(vMffc, 2) );
        printf( "Divs =%4d  ", nDivs );
        printf( "\n" );
    }
    printf( "Collected %d (%.1f %%) MFFCs and %d (%.1f %%) have no divisors (div ave for others is %.2f).\n", 
        Vec_WecSize(vMffcs), 100.0 * Vec_WecSize(vMffcs) / Gia_ManAndNum(p), 
        nDivs0, 100.0 * nDivs0 / Gia_ManAndNum(p), 
        1.0*nDivsAll/Abc_MaxInt(1, Vec_WecSize(vMffcs) - nDivs0) );
    printf( "Using %.2f MB for MFFCs and %.2f MB for pivots.   ", 
        Vec_WecMemory(vMffcs)/(1<<20), Vec_WecMemory(vPivots)/(1<<20) );
}